

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.h
# Opt level: O2

array<double,_3UL> * __thiscall
Layer::calculate(array<double,_3UL> *__return_storage_ptr__,Layer *this,double h)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = this->L;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar6 = -this->g0 / (this->R * dVar5);
    dVar5 = (h - this->h0) * dVar5 + this->T0;
    dVar4 = this->p0;
    dVar2 = pow(dVar5 / this->T0,dVar6);
    dVar1 = this->d0;
    dVar6 = pow(dVar5 / this->T0,dVar6 + -1.0);
    dVar2 = dVar2 * dVar4;
    dVar6 = dVar6 * dVar1;
  }
  else {
    dVar5 = this->T0;
    dVar4 = this->p0;
    dVar2 = exp((h - this->h0) * (-this->g0 / (this->R * dVar5)));
    dVar1 = this->d0;
    dVar6 = exp((h - this->h0) * (-this->g0 / (this->R * this->T0)));
    dVar2 = dVar2 * dVar4;
    dVar6 = dVar6 * dVar1;
  }
  __return_storage_ptr__->_M_elems[0] = dVar5;
  auVar3._8_4_ = SUB84(dVar6,0);
  auVar3._0_8_ = dVar2;
  auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
  *(undefined1 (*) [16])(__return_storage_ptr__->_M_elems + 1) = auVar3;
  return __return_storage_ptr__;
}

Assistant:

std::array<double, 3> calculate(double h) {
        double T, p, d;

        if (this->L == 0) {
            T = this->T0;
            p = this->p0 * exp(-this->g0 / (this->R * this->T0) * (h - this->h0));
            d = this->d0 * exp(-this->g0 / (this->R * this->T0) * (h - this->h0));
        } else {
            double C = -this->g0 / (this->L * this->R);
            T = this->temperature(h);
            p = this->p0 * pow((T / this->T0), C);
            d = this->d0 * pow((T / this->T0), C - 1);
        }
        std::array<double, 3> values = {T, p, d};
        return values;
    }